

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeSorterRowkey(VdbeCursor *pCsr,Mem *pOut)

{
  undefined2 uVar1;
  int n;
  VdbeSorter *pVVar2;
  int iVar3;
  PmaReader *pPVar4;
  SorterRecord *pSVar5;
  SorterRecord *__src;
  
  pVVar2 = pCsr->pSorter;
  if (pVVar2->bUsePMA == '\0') {
    pSVar5 = (pVVar2->list).pList;
    __src = pSVar5 + 1;
  }
  else {
    if (pVVar2->bUseThreads == '\0') {
      pPVar4 = pVVar2->pMerger->aReadr + pVVar2->pMerger->aTree[1];
    }
    else {
      pPVar4 = pVVar2->pReader;
    }
    __src = (SorterRecord *)pPVar4->aKey;
    pSVar5 = (SorterRecord *)&pPVar4->nKey;
  }
  n = pSVar5->nVal;
  if (pOut->szMalloc < n) {
    iVar3 = sqlite3VdbeMemGrow(pOut,n,0);
    if (iVar3 != 0) {
      return 7;
    }
  }
  else {
    pOut->z = pOut->zMalloc;
    pOut->flags = pOut->flags & 0xd;
  }
  pOut->n = n;
  uVar1 = pOut->flags;
  pOut->flags = uVar1 & 0xbe00 | 0x10;
  memcpy(pOut->z,__src,(long)n);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterRowkey(const VdbeCursor *pCsr, Mem *pOut){
  VdbeSorter *pSorter = pCsr->pSorter;
  void *pKey; int nKey;           /* Sorter key to copy into pOut */

  pKey = vdbeSorterRowkey(pSorter, &nKey);
  if( sqlite3VdbeMemClearAndResize(pOut, nKey) ){
    return SQLITE_NOMEM;
  }
  pOut->n = nKey;
  MemSetTypeFlag(pOut, MEM_Blob);
  memcpy(pOut->z, pKey, nKey);

  return SQLITE_OK;
}